

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::storage_moved_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,storage_moved_alert *this)

{
  char *__rhs;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  storage_moved_alert *local_18;
  storage_moved_alert *this_local;
  
  local_18 = this;
  this_local = (storage_moved_alert *)__return_storage_ptr__;
  torrent_alert::message_abi_cxx11_(&local_58,&this->super_torrent_alert);
  std::operator+(&local_38,&local_58," moved storage to: ");
  __rhs = storage_path(this);
  std::operator+(__return_storage_ptr__,&local_38,__rhs);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string storage_moved_alert::message() const
	{
		return torrent_alert::message() + " moved storage to: "
			+ storage_path();
	}